

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<DVector3a,_DVector3a>::Push(TArray<DVector3a,_DVector3a> *this,DVector3a *item)

{
  DVector3a *pDVar1;
  double *pdVar2;
  uint uVar3;
  DVector3a *pDVar4;
  double dVar5;
  
  Grow(this,1);
  pDVar4 = this->Array;
  uVar3 = this->Count;
  dVar5 = (item->pos).Y;
  pDVar1 = pDVar4 + uVar3;
  (pDVar1->pos).X = (item->pos).X;
  (pDVar1->pos).Y = dVar5;
  dVar5 = (item->angle).Degrees;
  pdVar2 = &pDVar4[uVar3].pos.Z;
  *pdVar2 = (item->pos).Z;
  pdVar2[1] = dVar5;
  this->Count = uVar3 + 1;
  return uVar3;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}